

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_lcp_3way_parallel<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  MergeResult MVar7;
  ostream *poVar8;
  uchar **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  uchar **ppuVar12;
  lcp_t *plVar13;
  lcp_t lVar14;
  lcp_t *__dest;
  char *__assertion;
  byte bVar15;
  uchar uVar16;
  byte bVar17;
  long lVar18;
  MergeResult MVar19;
  size_t sVar20;
  undefined1 auVar21 [16];
  double dVar22;
  lcp_t *in_stack_ffffffffffffff38;
  char local_b9;
  lcp_t *local_b8;
  size_t local_b0;
  MergeResult local_a4;
  long local_a0;
  uchar **local_98;
  lcp_t *local_90;
  uchar **local_88;
  lcp_t *local_80;
  lcp_t *local_78;
  uchar **local_70;
  lcp_t *local_68;
  uchar **local_60;
  lcp_t *local_58;
  uchar **local_50;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"mergesort_lcp_3way_parallel",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n=",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_b9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_b9,1);
  if (n < 0x20) {
    if (1 < n) {
      uVar10 = n & 0xffffffff;
      ppuVar9 = strings_input;
      do {
        pbVar1 = ppuVar9[1];
        ppuVar9 = ppuVar9 + 1;
        for (ppuVar12 = ppuVar9; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          pbVar2 = ppuVar12[-1];
          bVar15 = *pbVar2;
          bVar17 = *pbVar1;
          if (bVar15 != 0 && bVar15 == bVar17) {
            lVar18 = 1;
            do {
              bVar15 = pbVar2[lVar18];
              bVar17 = pbVar1[lVar18];
              if (bVar15 == 0) break;
              lVar18 = lVar18 + 1;
            } while (bVar15 == bVar17);
          }
          if (bVar15 <= bVar17) break;
          *ppuVar12 = pbVar2;
        }
        iVar3 = (int)uVar10;
        uVar10 = (ulong)(iVar3 - 1);
        *ppuVar12 = pbVar1;
      } while (2 < iVar3);
    }
    if (n == 1) {
      return SortedInPlace;
    }
    uVar10 = 0;
    do {
      uVar11 = uVar10 + 1 & 0xffffffff;
      uVar16 = *strings_input[uVar10];
      if (uVar16 == '\0') {
        lVar14 = 0;
      }
      else {
        lVar14 = 0;
        do {
          if (uVar16 != strings_input[uVar11][lVar14]) break;
          uVar16 = strings_input[uVar10][lVar14 + 1];
          lVar14 = lVar14 + 1;
        } while (uVar16 != '\0');
      }
      lcp_input[uVar10] = lVar14;
      uVar10 = uVar10 + 1;
      if (n - 1 <= uVar11) {
        return SortedInPlace;
      }
    } while( true );
  }
  auVar21._8_4_ = (int)(n >> 0x20);
  auVar21._0_8_ = n;
  auVar21._12_4_ = 0x45300000;
  uVar11 = n / 3;
  dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
  uVar10 = (ulong)dVar22;
  uVar10 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
  local_b8 = lcp_output;
  local_b0 = n;
  MVar5 = mergesort_lcp_3way_parallel<true>
                    (strings_input,strings_output,lcp_input,lcp_output,uVar11);
  local_88 = strings_input + uVar11;
  local_60 = strings_output + uVar11;
  local_90 = lcp_input + uVar11;
  local_68 = lcp_output + uVar11;
  local_38 = uVar10 - uVar11;
  local_48 = uVar11;
  MVar6 = mergesort_lcp_3way_parallel<true>(local_88,local_60,local_90,local_68,local_38);
  plVar13 = local_b8;
  local_a0 = uVar10 * 8;
  local_70 = strings_input + uVar10;
  local_50 = strings_output + uVar10;
  local_78 = lcp_input + uVar10;
  local_58 = local_b8 + uVar10;
  local_40 = local_b0 - uVar10;
  local_98 = strings_output;
  local_80 = lcp_input;
  MVar7 = mergesort_lcp_3way_parallel<true>(local_70,local_50,local_78,local_58,local_40);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"mergesort_lcp_3way_parallel",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): m0=",7);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,MVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", m1=",5);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,MVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", m2=",5);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,MVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  sVar4 = local_b0;
  MVar19 = MVar5;
  if (MVar5 != MVar6) {
    sVar20 = local_48 * 8;
    if (MVar6 == MVar7) {
      local_a4 = MVar7;
      if (MVar5 == SortedInPlace) {
        memcpy(local_98,strings_input,sVar20);
        plVar13 = local_b8;
        memcpy(local_b8,local_80,sVar20);
      }
      else {
        memcpy(strings_input,local_98,sVar20);
        plVar13 = local_b8;
        memcpy(local_80,local_b8,sVar20);
      }
      MVar5 = (MergeResult)(MVar5 == SortedInPlace);
      MVar7 = local_a4;
      MVar19 = MVar6;
    }
    else {
      if (MVar6 == SortedInPlace) {
        MVar6 = SortedInTemp;
        sVar20 = local_a0 + local_48 * -8;
        MVar19 = MVar6;
        if (sVar20 == 0) goto LAB_00241e83;
        memcpy(local_60,local_88,sVar20);
        plVar13 = local_90;
        __dest = local_68;
      }
      else {
        MVar6 = SortedInPlace;
        sVar20 = local_a0 + local_48 * -8;
        MVar19 = SortedInPlace;
        if (sVar20 == 0) goto LAB_00241e83;
        memcpy(local_88,local_60,sVar20);
        plVar13 = local_68;
        __dest = local_90;
      }
      memcpy(__dest,plVar13,sVar20);
      plVar13 = local_b8;
      MVar19 = MVar6;
    }
  }
LAB_00241e83:
  if (MVar19 != MVar7) {
    if (MVar7 == SortedInPlace) {
      MVar7 = SortedInTemp;
      sVar20 = sVar4 * 8 - local_a0;
      if (sVar20 != 0) {
        memcpy(local_50,local_70,sVar20);
        memcpy(local_58,local_78,sVar20);
        MVar7 = SortedInTemp;
      }
    }
    else {
      MVar7 = SortedInPlace;
      sVar20 = sVar4 * 8 - local_a0;
      if (sVar20 != 0) {
        local_b0 = CONCAT44(local_b0._4_4_,MVar19);
        memcpy(local_70,local_50,sVar20);
        memcpy(local_78,local_58,sVar20);
        MVar7 = SortedInPlace;
        MVar19 = (MergeResult)local_b0;
      }
    }
  }
  if (MVar5 == MVar19) {
    if (MVar5 == MVar7) {
      if (MVar5 != SortedInPlace) {
        merge_lcp_3way<false>
                  (local_98,plVar13,local_48,local_60,local_68,local_38,local_50,local_58,local_40,
                   strings_input,in_stack_ffffffffffffff38);
        return SortedInPlace;
      }
      merge_lcp_3way<false>
                (strings_input,local_80,local_48,local_88,local_90,local_38,local_70,local_78,
                 local_40,local_98,in_stack_ffffffffffffff38);
      return SortedInTemp;
    }
    __assertion = "m1 == m2";
  }
  else {
    __assertion = "m0 == m1";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x397,
                "MergeResult mergesort_lcp_3way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
               );
}

Assistant:

MergeResult
mergesort_lcp_3way_parallel(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0, m1, m2;
#pragma omp task shared(m0)
	m0 = mergesort_lcp_3way_parallel<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
#pragma omp task shared(m1)
	m1 = mergesort_lcp_3way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
#pragma omp task shared(m2)
	m2 = mergesort_lcp_3way_parallel<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
#pragma omp taskwait
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}